

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.h
# Opt level: O2

void randomPos_RandomSize<FakeAllocatorUnderTest,(MEM_ACCESS_TYPE)2>
               (FakeAllocatorUnderTest *allocatorUnderTest,size_t iterCount,size_t maxItems,
               size_t maxItemSizeExp,size_t threadID)

{
  FakeAllocatorUnderTest *this;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  uint8_t *puVar7;
  TestBin *pTVar8;
  byte bVar9;
  long lVar10;
  uint32_t uVar11;
  double *pdVar12;
  size_t j;
  size_t sVar13;
  unsigned_long obj_2;
  size_t k;
  long in_FS_OFFSET;
  TestBin *local_f0;
  TestBin *local_e8;
  FakeAllocatorUnderTest *local_e0;
  TestBin *local_d8;
  size_t maxItems_local;
  anon_class_16_2_280ae672 local_c8;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  size_t local_90;
  TestBin *local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  Pareto_80_20_6_Data paretoData;
  
  local_e0 = allocatorUnderTest;
  maxItems_local = maxItems;
  local_90 = iterCount;
  local_88 = (TestBin *)maxItemSizeExp;
  local_80 = threadID;
  FakeAllocatorUnderTest::init(allocatorUnderTest,(EVP_PKEY_CTX *)threadID);
  paretoData.probabilityRanges._0_8_ = &maxItems_local;
  nodecpp::assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,randomPos_RandomSize<FakeAllocatorUnderTest,(MEM_ACCESS_TYPE)2>(FakeAllocatorUnderTest&,unsigned_long,unsigned_long,unsigned_long,unsigned_long)::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
             ,0x1de,(anon_class_8_1_ff09363a *)&paretoData,"maxItems <= UINT32_MAX");
  paretoData.probabilityRanges[0] = 0x431bde82;
  paretoData.probabilityRanges[5] = 0xfffbce41;
  uVar11 = 0x431bde82;
  for (lVar10 = 1; lVar10 != 5; lVar10 = lVar10 + 1) {
    uVar11 = uVar11 + (int)(long)(Pareto_80_20_6[lVar10] * 4294967295.0);
    paretoData.probabilityRanges[lVar10] = uVar11;
  }
  paretoData.offsets[0] = 0;
  paretoData.offsets[7] = (uint32_t)maxItems_local;
  uVar11 = 0;
  pdVar12 = Pareto_80_20_6 + 6;
  for (lVar10 = 7; lVar10 != 0xd; lVar10 = lVar10 + 1) {
    uVar11 = uVar11 + (int)(long)(*pdVar12 * (double)(maxItems_local & 0xffffffff));
    paretoData.probabilityRanges[lVar10] = uVar11;
    pdVar12 = pdVar12 + -1;
  }
  GetMillisecondCount();
  lVar10 = 0;
  local_f0 = (TestBin *)operator_new__(-(ulong)(maxItems_local >> 0x3c != 0) | maxItems_local << 4);
  local_c8.idx = (unsigned_long *)&local_f0;
  nodecpp::assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,randomPos_RandomSize<FakeAllocatorUnderTest,(MEM_ACCESS_TYPE)2>(FakeAllocatorUnderTest&,unsigned_long,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
             ,0x1ee,(anon_class_8_1_81482042 *)&local_c8,"baseBuff");
  memset(local_f0,0,maxItems_local << 4);
  uVar4 = 0;
  while (uVar4 < maxItems_local >> 5) {
    uVar2 = *(long *)(in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
    *(ulong *)(in_FS_OFFSET + -0x28) = uVar2;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * 0x6595a395a1ec5333;
    lVar3 = (uVar2 >> 0x20 ^ uVar2) * 0x6595a395a1ec5333;
    local_a8 = (ulong)((uint)((ulong)lVar3 >> 0x20) ^ (uint)lVar3);
    local_b8 = uVar4;
    local_b0 = lVar10;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      if (((uint)local_a8 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
        uVar4 = *(long *)(in_FS_OFFSET + -0x28) + 0x6595a395a1ec5333;
        *(ulong *)(in_FS_OFFSET + -0x28) = uVar4;
        uVar4 = (uVar4 >> 0x20 ^ uVar4) * 0x6595a395a1ec5333;
        uVar4 = (uVar4 >> 0x20 ^ uVar4) * 0x6595a395a1ec5333;
        uVar4 = uVar4 >> 0x20 ^ uVar4;
        local_e8 = local_88;
        local_c8.idx = (unsigned_long *)&local_e8;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_1_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x58,(anon_class_8_1_60f0ca16 *)&local_c8,"maxSizeExp >= 3");
        local_e8 = (TestBin *)((long)&local_e8[-1].sz + 5);
        bVar9 = (byte)local_e8;
        uVar1 = (~(uint)(-1L << (bVar9 & 0x3f)) & (uint)uVar4) + 1;
        local_d8 = (TestBin *)0x0;
        if (uVar1 != 0) {
          for (; (uVar1 >> (long)local_d8 & 1) == 0;
              local_d8 = (TestBin *)((long)&local_d8->ptr + 1)) {
          }
        }
        local_c8.idx = (unsigned_long *)&local_d8;
        local_c8.maxSizeExp = (size_t *)&local_e8;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_2_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x66,&local_c8,"idx <= maxSizeExp");
        lVar5 = 1L << ((char)local_d8 + 2U & 0x3f);
        sVar13 = lVar5 + (lVar5 - 1U & uVar4 >> (bVar9 & 0x3f)) + 1;
        *(size_t *)((long)&local_f0->sz + lVar10) = sVar13;
        pvVar6 = FakeAllocatorUnderTest::allocate(local_e0,sVar13);
        *(void **)((long)&local_f0->ptr + lVar10) = pvVar6;
        memset(*(void **)((long)&local_f0->ptr + lVar10),(int)sVar13,sVar13);
      }
      lVar10 = lVar10 + 0x10;
    }
    lVar10 = local_b0 + 0x200;
    uVar4 = local_b8 + 1;
  }
  uVar4 = rdtsc();
  local_e0->testRes->rdtscSetup =
       uVar4 & 0xffffffff00000000 | CONCAT44((uint)(maxItems_local >> 0x25),(int)uVar4);
  local_78 = local_90 / 10000;
  local_a8 = CONCAT44(local_a8._4_4_,paretoData.probabilityRanges[1]);
  local_b8 = CONCAT44(local_b8._4_4_,paretoData.probabilityRanges[2]);
  local_94 = paretoData.probabilityRanges[3];
  local_98 = paretoData.probabilityRanges[4];
  pTVar8 = (TestBin *)0x0;
  local_9c = paretoData.probabilityRanges[5];
  obj_2 = 0;
  local_b0 = CONCAT44(local_b0._4_4_,paretoData.probabilityRanges[0]);
  uVar4 = 0;
  uVar11 = paretoData.probabilityRanges[0];
  while (uVar4 != local_78) {
    local_70 = uVar4;
    for (lVar10 = 0; lVar10 != 10000; lVar10 = lVar10 + 1) {
      lVar3 = *(long *)(in_FS_OFFSET + -0x28);
      uVar4 = lVar3 + 0x6595a395a1ec5333;
      *(ulong *)(in_FS_OFFSET + -0x28) = uVar4;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * 0x6595a395a1ec5333;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * 0x6595a395a1ec5333;
      uVar1 = (uint)uVar4 ^ (uint)(uVar4 >> 0x20);
      if (uVar1 < uVar11) {
        lVar5 = 0;
      }
      else {
        lVar5 = 1;
        if ((uint)local_a8 <= uVar1) {
          lVar5 = 2;
          if ((uint)local_b8 <= uVar1) {
            lVar5 = 3;
            if (local_94 <= uVar1) {
              lVar5 = 4;
              if (local_98 <= uVar1) {
                lVar5 = 6 - (ulong)(uVar1 < local_9c);
              }
            }
          }
        }
      }
      lVar5 = (uVar4 >> 0x20) % (ulong)(paretoData.offsets[lVar5 + 1] - paretoData.offsets[lVar5]) +
              (ulong)paretoData.offsets[lVar5];
      puVar7 = local_f0[lVar5].ptr;
      if (puVar7 == (uint8_t *)0x0) {
        uVar4 = lVar3 + 0xcb2b472b43d8a666;
        *(ulong *)(in_FS_OFFSET + -0x28) = uVar4;
        uVar4 = (uVar4 >> 0x20 ^ uVar4) * 0x6595a395a1ec5333;
        uVar4 = (uVar4 >> 0x20 ^ uVar4) * 0x6595a395a1ec5333;
        uVar4 = uVar4 >> 0x20 ^ uVar4;
        local_e8 = local_88;
        local_c8.idx = (unsigned_long *)&local_e8;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_1_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x58,(anon_class_8_1_60f0ca16 *)&local_c8,"maxSizeExp >= 3");
        local_e8 = (TestBin *)((long)&local_e8[-1].sz + 5);
        bVar9 = (byte)local_e8;
        uVar1 = (~(uint)(-1L << (bVar9 & 0x3f)) & (uint)uVar4) + 1;
        local_d8 = (TestBin *)0x0;
        if (uVar1 != 0) {
          for (; (uVar1 >> (long)local_d8 & 1) == 0;
              local_d8 = (TestBin *)((long)&local_d8->ptr + 1)) {
          }
        }
        local_c8.idx = (unsigned_long *)&local_d8;
        local_c8.maxSizeExp = (size_t *)&local_e8;
        nodecpp::assert::
        nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,calcSizeWithStatsAdjustment(unsigned_long,unsigned_long)::_lambda()_2_>
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/test/random_test.h"
                   ,0x66,&local_c8,"idx <= maxSizeExp");
        lVar3 = 1L << ((char)local_d8 + 2U & 0x3f);
        sVar13 = lVar3 + (lVar3 - 1U & uVar4 >> (bVar9 & 0x3f)) + 1;
        local_f0[lVar5].sz = sVar13;
        puVar7 = (uint8_t *)FakeAllocatorUnderTest::allocate(local_e0,sVar13);
        local_f0[lVar5].ptr = puVar7;
        pTVar8 = (TestBin *)memset(local_f0[lVar5].ptr,(int)sVar13,sVar13);
        uVar11 = (uint)local_b0;
      }
      else {
        pTVar8 = local_f0 + lVar5;
        uVar4 = pTVar8->sz;
        for (uVar2 = 0; uVar4 >> 3 != uVar2; uVar2 = uVar2 + 1) {
          obj_2 = obj_2 + *(long *)(puVar7 + uVar2 * 8);
        }
        for (uVar2 = 0; ((uint)uVar4 & 7) != uVar2; uVar2 = uVar2 + 1) {
          obj_2 = obj_2 + puVar7[uVar2 + (uVar4 & 0xfffffffffffffff8)];
        }
        pTVar8->ptr = (uint8_t *)0x0;
      }
    }
    uVar4 = local_70 + 1;
  }
  uVar4 = rdtsc();
  local_e0->testRes->rdtscMainLoop =
       uVar4 & 0xffffffff00000000 | CONCAT44((int)((ulong)pTVar8 >> 0x20),(int)uVar4);
  for (sVar13 = 0; sVar13 != maxItems_local; sVar13 = sVar13 + 1) {
    puVar7 = local_f0[sVar13].ptr;
    if (puVar7 != (uint8_t *)0x0) {
      uVar4 = local_f0[sVar13].sz;
      for (uVar2 = 0; uVar4 >> 3 != uVar2; uVar2 = uVar2 + 1) {
        obj_2 = obj_2 + *(long *)(puVar7 + uVar2 * 8);
      }
      for (uVar2 = 0; ((uint)uVar4 & 7) != uVar2; uVar2 = uVar2 + 1) {
        obj_2 = obj_2 + puVar7[uVar2 + (uVar4 & 0xfffffffffffffff8)];
      }
    }
  }
  if (local_f0 != (TestBin *)0x0) {
    operator_delete__(local_f0);
  }
  this = local_e0;
  FakeAllocatorUnderTest::deinit(local_e0);
  FakeAllocatorUnderTest::doWhateverAfterCleanupPhase(this);
  nodecpp::log::default_log::info<char_const*,unsigned_long,unsigned_long,unsigned_long>
            ("about to exit thread {} ({} operations performed) [ctr = {}]...",local_80,local_90,
             obj_2);
  return;
}

Assistant:

void randomPos_RandomSize( AllocatorUnderTest& allocatorUnderTest, size_t iterCount, size_t maxItems, size_t maxItemSizeExp, size_t threadID )
{
	constexpr bool doMemAccess = mat != MEM_ACCESS_TYPE::none;
	constexpr bool doFullAccess = mat == MEM_ACCESS_TYPE::full;
//	nodecpp::log::default_log::info( "rnd_seed = {}, iterCount = {}, maxItems = {}, maxItemSizeExp = {}", rnd_seed, iterCount, maxItems, maxItemSizeExp );
	allocatorUnderTest.init( threadID );

	size_t dummyCtr = 0;

	Pareto_80_20_6_Data paretoData;
	NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, maxItems <= UINT32_MAX );
	Pareto_80_20_6_Init( paretoData, (uint32_t)maxItems );

	size_t start = GetMillisecondCount();

	struct TestBin
	{
		uint8_t* ptr;
		size_t sz;
	};

	TestBin* baseBuff = nullptr; 
	if ( !allocatorUnderTest.isFake() )
		baseBuff = reinterpret_cast<TestBin*>( allocatorUnderTest.allocate( maxItems * sizeof(TestBin) ) );
	else
		baseBuff = new TestBin [ maxItems ]; // just using standard allocator
	NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, baseBuff );
	memset( baseBuff, 0, maxItems * sizeof( TestBin ) );

	// setup (saturation)
	for ( size_t i=0;i<maxItems/32; ++i )
	{
		uint32_t randNum = (uint32_t)( rng64() );
		for ( size_t j=0; j<32; ++j )
			if ( (randNum >> j) & 1 )
			{
				size_t randNumSz = rng64();
				size_t sz = calcSizeWithStatsAdjustment( randNumSz, maxItemSizeExp );
				baseBuff[i*32+j].sz = sz;
				baseBuff[i*32+j].ptr = reinterpret_cast<uint8_t*>( allocatorUnderTest.allocate( sz ) );
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
						memset( baseBuff[i*32+j].ptr, (uint8_t)sz, sz );
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						baseBuff[i*32+j].ptr[sz/2] = (uint8_t)sz;
					}
				}
			}
	}
	allocatorUnderTest.doWhateverAfterSetupPhase();

	// main loop
	for ( size_t j=0;j<iterCount/10000; ++j )
	{
		for ( size_t k=0;k<10000; ++k )
		{
			size_t randNum = rng64();
	//		size_t idx = randNum % maxItems;
			uint32_t rnum1 = (uint32_t)randNum;
			uint32_t rnum2 = (uint32_t)(randNum >> 32);
			size_t idx = Pareto_80_20_6_Rand( paretoData, rnum1, rnum2 );
			if ( baseBuff[idx].ptr )
			{
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
					{
						size_t i=0;
						for ( ; i<baseBuff[idx].sz/sizeof(size_t ); ++i )
							dummyCtr += ( reinterpret_cast<size_t*>( baseBuff[idx].ptr) )[i];
						uint8_t* tail = baseBuff[idx].ptr + i * sizeof(size_t );
						for ( i=0; i<baseBuff[idx].sz % sizeof(size_t); ++i )
							dummyCtr += tail[i];
					}
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						dummyCtr += baseBuff[idx].ptr[baseBuff[idx].sz/2];
					}
				}
				allocatorUnderTest.deallocate( baseBuff[idx].ptr );
				baseBuff[idx].ptr = 0;
			}
			else
			{
				size_t sz = calcSizeWithStatsAdjustment( rng64(), maxItemSizeExp );
				baseBuff[idx].sz = sz;
				baseBuff[idx].ptr = reinterpret_cast<uint8_t*>( allocatorUnderTest.allocate( sz ) );
				if constexpr ( doMemAccess )
				{
					if constexpr ( doFullAccess )
						memset( baseBuff[idx].ptr, (uint8_t)sz, sz );
					else
					{
						static_assert( mat == MEM_ACCESS_TYPE::single, "" );
						baseBuff[idx].ptr[sz/2] = (uint8_t)sz;
					}
				}
			}
		}
		allocatorUnderTest.doWhateverWithinMainLoopPhase();
	}
	allocatorUnderTest.doWhateverAfterMainLoopPhase();

	// exit
	for ( size_t idx=0; idx<maxItems; ++idx )
		if ( baseBuff[idx].ptr )
		{
			if constexpr ( doMemAccess )
			{
				if constexpr ( doFullAccess )
				{
					size_t i=0;
					for ( ; i<baseBuff[idx].sz/sizeof(size_t ); ++i )
						dummyCtr += ( reinterpret_cast<size_t*>( baseBuff[idx].ptr) )[i];
					uint8_t* tail = baseBuff[idx].ptr + i * sizeof(size_t );
					for ( i=0; i<baseBuff[idx].sz % sizeof(size_t); ++i )
						dummyCtr += tail[i];
				}
				else
				{
					static_assert( mat == MEM_ACCESS_TYPE::single, "" );
					dummyCtr += baseBuff[idx].ptr[baseBuff[idx].sz/2];
				}
			}
			allocatorUnderTest.deallocate( baseBuff[idx].ptr );
		}

	if ( !allocatorUnderTest.isFake() )
		allocatorUnderTest.deallocate( baseBuff );
	else
		delete [] baseBuff;
	allocatorUnderTest.deinit();
	allocatorUnderTest.doWhateverAfterCleanupPhase();
		
	nodecpp::log::default_log::info( "about to exit thread {} ({} operations performed) [ctr = {}]...", threadID, iterCount, dummyCtr );
}